

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O2

MPP_RET vp8e_swap_endian(RK_U32 *buf,RK_U32 bytes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  
  puVar4 = buf + 1;
  for (uVar3 = bytes >> 2; 0 < (int)uVar3; uVar3 = uVar3 - 2) {
    uVar1 = puVar4[-1];
    uVar2 = *puVar4;
    puVar4[-1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    *puVar4 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    puVar4 = puVar4 + 2;
  }
  return MPP_OK;
}

Assistant:

MPP_RET vp8e_swap_endian(RK_U32 *buf, RK_U32 bytes)
{
    RK_U32 i = 0;
    RK_S32 words = bytes / 4;

    while (words > 0) {
        RK_U32 val = buf[i];
        RK_U32 tmp = 0;

        tmp |= (val & 0xFF) << 24;
        tmp |= (val & 0xFF00) << 8;
        tmp |= (val & 0xFF0000) >> 8;
        tmp |= (val & 0xFF000000) >> 24;

        {
            RK_U32 val2 = buf[i + 1];
            RK_U32 tmp2 = 0;

            tmp2 |= (val2 & 0xFF) << 24;
            tmp2 |= (val2 & 0xFF00) << 8;
            tmp2 |= (val2 & 0xFF0000) >> 8;
            tmp2 |= (val2 & 0xFF000000) >> 24;

            buf[i] = tmp2;
            words--;
            i++;
        }

        buf[i] = tmp;
        words--;
        i++;
    }
    return MPP_OK;
}